

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest_StripSourceRetentionFieldOptions_Test
::TestBody(RetentionStripTest_StripSourceRetentionFieldOptions_Test *this)

{
  FileDescriptor *this_00;
  Descriptor *this_01;
  FieldDescriptor *field;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar1;
  char *pcVar2;
  string_view contents;
  string_view name;
  string_view name_00;
  string_view data;
  string_view file_name;
  AssertionResult gtest_ar;
  FieldOptions expected_options;
  char local_720 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_718;
  undefined1 local_710 [48];
  RepeatedPtrFieldBase local_6e0 [8];
  FieldOptions local_618;
  FieldOptions local_580;
  FieldOptions local_4e8;
  FieldOptions local_450;
  FieldOptions local_3b8;
  FieldOptions local_320;
  FieldOptions local_288;
  FieldOptions local_1f0;
  FieldOptions local_158;
  FieldOptions local_c0;
  
  contents._M_str =
       "\n      message TestMessage {\n        optional string test_field = 1 [(source_retention_option) = 123, (options) = {\n          i1: 123\n          i2: 456\n          c { s: \"abc\" }\n          rc { s: \"abc\" }\n        }, (repeated_options) = {\n          i1: 111 i2: 222\n        }];\n      }\n\n      message Options {\n        optional int32 i1 = 1 [retention = RETENTION_SOURCE];\n        optional int32 i2 = 2;\n        message ChildMessage {\n          optional string s = 1 [retention = RETENTION_SOURCE];\n        }\n        optional ChildMessage c = 3;\n        repeated ChildMessage rc = 4;\n      }\n\n      extend google.protobuf.FieldOptions {\n        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];\n        optional Options options = 50001;\n        repeated Options repeated_options = 50002;\n      }"
  ;
  contents._M_len = 0x335;
  file_name._M_str = "foo.proto";
  file_name._M_len = 9;
  this_00 = RetentionStripTest::ParseSchema(&this->super_RetentionStripTest,contents,file_name);
  data._M_str = 
  "\n        [google.protobuf.internal.options] {\n          i2: 456\n          c {}\n          rc {}\n        }\n        [google.protobuf.internal.repeated_options] { i2: 222 }"
  ;
  data._M_len = 0xa8;
  RetentionStripTest::BuildDynamicProto<google::protobuf::FieldOptions>
            (&local_580,&this->super_RetentionStripTest,data);
  name._M_str = "TestMessage";
  name._M_len = 0xb;
  this_01 = FileDescriptor::FindMessageTypeByName(this_00,name);
  if (this_01 == (Descriptor *)0x0) {
    absl::lts_20250127::log_internal::DieBecauseNull
              ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x189,"file->FindMessageTypeByName(\"TestMessage\")");
  }
  name_00._M_str = "test_field";
  name_00._M_len = 10;
  field = Descriptor::FindFieldByName(this_01,name_00);
  if (field != (FieldDescriptor *)0x0) {
    FieldOptions::FieldOptions(&local_320,(Arena *)0x0,&local_580);
    FieldOptions::FieldOptions((FieldOptions *)local_710,(Arena *)0x0,&local_320);
    FieldOptions::FieldOptions(&local_c0,(Arena *)0x0,(FieldOptions *)local_710);
    FieldOptions::~FieldOptions((FieldOptions *)local_710);
    FieldOptions::FieldOptions((FieldOptions *)local_710,(Arena *)0x0,&local_c0);
    FieldOptions::FieldOptions(&local_618,(Arena *)0x0,(FieldOptions *)local_710);
    FieldOptions::~FieldOptions((FieldOptions *)local_710);
    StripSourceRetentionOptions((FileDescriptorProto *)local_710,this_00,false);
    pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                       (local_6e0,0);
    protobuf::internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
              (&(pVVar1->field_0)._impl_.field_.super_RepeatedPtrFieldBase,0);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
    ::operator()(local_720,(char *)&local_618,
                 (FieldOptions *)
                 "StripSourceRetentionOptions(*file).message_type(0).field(0).options()");
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_710);
    FieldOptions::~FieldOptions(&local_618);
    FieldOptions::~FieldOptions(&local_c0);
    FieldOptions::~FieldOptions(&local_320);
    if (local_720[0] == '\0') {
      testing::Message::Message((Message *)local_710);
      if (local_718 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar2 = (local_718->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_618,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                 ,399,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_618,(Message *)local_710);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_618);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_710._0_8_ !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(_func_int **)local_710._0_8_ + 8))();
      }
    }
    if (local_718 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_718,local_718);
    }
    FieldOptions::FieldOptions(&local_3b8,(Arena *)0x0,&local_580);
    FieldOptions::FieldOptions((FieldOptions *)local_710,(Arena *)0x0,&local_3b8);
    FieldOptions::FieldOptions(&local_158,(Arena *)0x0,(FieldOptions *)local_710);
    FieldOptions::~FieldOptions((FieldOptions *)local_710);
    FieldOptions::FieldOptions((FieldOptions *)local_710,(Arena *)0x0,&local_158);
    FieldOptions::FieldOptions(&local_618,(Arena *)0x0,(FieldOptions *)local_710);
    FieldOptions::~FieldOptions((FieldOptions *)local_710);
    StripSourceRetentionOptions((DescriptorProto *)local_710,this_01);
    protobuf::internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
              ((RepeatedPtrFieldBase *)(local_710 + 0x18),0);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
    ::operator()(local_720,(char *)&local_618,
                 (FieldOptions *)"StripSourceRetentionOptions(*message).field(0).options()");
    DescriptorProto::~DescriptorProto((DescriptorProto *)local_710);
    FieldOptions::~FieldOptions(&local_618);
    FieldOptions::~FieldOptions(&local_158);
    FieldOptions::~FieldOptions(&local_3b8);
    if (local_720[0] == '\0') {
      testing::Message::Message((Message *)local_710);
      if (local_718 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar2 = (local_718->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_618,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                 ,0x191,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_618,(Message *)local_710);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_618);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_710._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(_func_int **)local_710._0_8_ + 8))();
      }
    }
    if (local_718 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_718,local_718);
    }
    FieldOptions::FieldOptions(&local_450,(Arena *)0x0,&local_580);
    FieldOptions::FieldOptions((FieldOptions *)local_710,(Arena *)0x0,&local_450);
    FieldOptions::FieldOptions(&local_1f0,(Arena *)0x0,(FieldOptions *)local_710);
    FieldOptions::~FieldOptions((FieldOptions *)local_710);
    FieldOptions::FieldOptions((FieldOptions *)local_710,(Arena *)0x0,&local_1f0);
    FieldOptions::FieldOptions(&local_618,(Arena *)0x0,(FieldOptions *)local_710);
    FieldOptions::~FieldOptions((FieldOptions *)local_710);
    StripSourceRetentionOptions((FieldDescriptorProto *)local_710,field);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
    ::operator()(local_720,(char *)&local_618,
                 (FieldOptions *)"StripSourceRetentionOptions(*field).options()");
    FieldDescriptorProto::~FieldDescriptorProto((FieldDescriptorProto *)local_710);
    FieldOptions::~FieldOptions(&local_618);
    FieldOptions::~FieldOptions(&local_1f0);
    FieldOptions::~FieldOptions(&local_450);
    if (local_720[0] == '\0') {
      testing::Message::Message((Message *)local_710);
      if (local_718 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar2 = (local_718->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_618,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                 ,0x193,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_618,(Message *)local_710);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_618);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_710._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(_func_int **)local_710._0_8_ + 8))();
      }
    }
    if (local_718 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_718,local_718);
    }
    FieldOptions::FieldOptions(&local_4e8,(Arena *)0x0,&local_580);
    FieldOptions::FieldOptions((FieldOptions *)local_710,(Arena *)0x0,&local_4e8);
    FieldOptions::FieldOptions(&local_288,(Arena *)0x0,(FieldOptions *)local_710);
    FieldOptions::~FieldOptions((FieldOptions *)local_710);
    FieldOptions::FieldOptions((FieldOptions *)local_710,(Arena *)0x0,&local_288);
    FieldOptions::FieldOptions(&local_618,(Arena *)0x0,(FieldOptions *)local_710);
    FieldOptions::~FieldOptions((FieldOptions *)local_710);
    StripLocalSourceRetentionOptions((FieldOptions *)local_710,field);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
    ::operator()(local_720,(char *)&local_618,
                 (FieldOptions *)"StripLocalSourceRetentionOptions(*field)");
    FieldOptions::~FieldOptions((FieldOptions *)local_710);
    FieldOptions::~FieldOptions(&local_618);
    FieldOptions::~FieldOptions(&local_288);
    FieldOptions::~FieldOptions(&local_4e8);
    if (local_720[0] == '\0') {
      testing::Message::Message((Message *)local_710);
      if (local_718 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar2 = (local_718->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_618,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                 ,0x195,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_618,(Message *)local_710);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_618);
      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )local_710._0_8_ !=
          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(_func_int **)local_710._0_8_ + 8))();
      }
    }
    if (local_718 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_718,local_718);
    }
    FieldOptions::~FieldOptions(&local_580);
    return;
  }
  absl::lts_20250127::log_internal::DieBecauseNull
            ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
             ,0x18b,"message->FindFieldByName(\"test_field\")");
}

Assistant:

TEST_F(RetentionStripTest, StripSourceRetentionFieldOptions) {
  const FileDescriptor* file = ParseSchema(R"schema(
      message TestMessage {
        optional string test_field = 1 [(source_retention_option) = 123, (options) = {
          i1: 123
          i2: 456
          c { s: "abc" }
          rc { s: "abc" }
        }, (repeated_options) = {
          i1: 111 i2: 222
        }];
      }

      message Options {
        optional int32 i1 = 1 [retention = RETENTION_SOURCE];
        optional int32 i2 = 2;
        message ChildMessage {
          optional string s = 1 [retention = RETENTION_SOURCE];
        }
        optional ChildMessage c = 3;
        repeated ChildMessage rc = 4;
      }

      extend google.protobuf.FieldOptions {
        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];
        optional Options options = 50001;
        repeated Options repeated_options = 50002;
      })schema");

  FieldOptions expected_options = BuildDynamicProto<FieldOptions>(
      R"pb(
        [google.protobuf.internal.options] {
          i2: 456
          c {}
          rc {}
        }
        [google.protobuf.internal.repeated_options] { i2: 222 })pb");
  const Descriptor* message =
      ABSL_DIE_IF_NULL(file->FindMessageTypeByName("TestMessage"));
  const FieldDescriptor* field =
      ABSL_DIE_IF_NULL(message->FindFieldByName("test_field"));

  EXPECT_THAT(
      StripSourceRetentionOptions(*file).message_type(0).field(0).options(),
      EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*message).field(0).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*field).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripLocalSourceRetentionOptions(*field),
              EqualsProto(expected_options));
}